

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  string *psVar5;
  string *in_RDI;
  string local_2a0 [32];
  FilePath local_280;
  undefined1 local_260 [8];
  FilePath result;
  string local_238;
  FilePath local_218;
  allocator<char> local_1f1;
  string local_1f0;
  FilePath local_1d0;
  FilePath local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  FilePath output_name;
  string local_140;
  FilePath local_120;
  allocator<char> local_f9;
  string local_f8;
  FilePath local_d8;
  FilePath local_b8;
  char *local_98;
  char *colon;
  string local_88 [48];
  string local_58 [8];
  string format;
  char *gtest_output_flag;
  string s;
  
  std::__cxx11::string::string((string *)&gtest_output_flag,(string *)FLAGS_gtest_output_abi_cxx11_)
  ;
  format.field_2._8_8_ = std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_88,"xml",(allocator<char> *)((long)&colon + 7));
    std::__cxx11::string::operator=(local_58,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&colon + 7));
  }
  local_98 = strchr((char *)format.field_2._8_8_,0x3a);
  if (local_98 == (char *)0x0) {
    pUVar3 = UnitTest::GetInstance();
    pcVar4 = UnitTest::original_working_dir(pUVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar4,&local_f9);
    FilePath::FilePath(&local_d8,&local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"test_detail",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath(&local_120,&local_140);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    FilePath::MakeFileName(&local_b8,&local_d8,&local_120,0,pcVar4);
    psVar5 = FilePath::string_abi_cxx11_(&local_b8);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
    FilePath::~FilePath(&local_b8);
    FilePath::~FilePath(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator
              ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::~FilePath(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    output_name.pathname_.field_2._8_4_ = 1;
  }
  else {
    pcVar4 = local_98 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar4,&local_189);
    FilePath::FilePath((FilePath *)local_168,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)local_168);
    if (!bVar1) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar4,&local_1f1);
      FilePath::FilePath(&local_1d0,&local_1f0);
      pcVar4 = local_98 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,pcVar4,
                 (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_218,&local_238);
      FilePath::ConcatPaths(&local_1b0,&local_1d0,&local_218);
      FilePath::operator=((FilePath *)local_168,&local_1b0);
      FilePath::~FilePath(&local_1b0);
      FilePath::~FilePath(&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator
                ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
    }
    bVar1 = FilePath::IsDirectory((FilePath *)local_168);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_260,(FilePath *)local_168,&local_280,pcVar4);
      std::__cxx11::string::~string(local_2a0);
      FilePath::~FilePath(&local_280);
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_260);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
      FilePath::~FilePath((FilePath *)local_260);
    }
    else {
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_168);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    FilePath::~FilePath((FilePath *)local_168);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&gtest_output_flag);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}